

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreLowerPeeps.cpp
# Opt level: O2

Instr * Lowerer::TryShiftAdd(Instr *instrAdd,Opnd *opndFold,Opnd *opndAdd)

{
  StackSym *sym;
  StackSym *sym_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int32 offset;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  IntConstOpnd *pIVar7;
  ulong uVar8;
  JITTimeFunctionBody *pJVar9;
  char16 *pcVar10;
  Opnd *pOVar11;
  RegOpnd *indexOpnd;
  IndirOpnd *src;
  Instr *pIVar12;
  uint uVar13;
  Instr *pIVar14;
  Instr *this;
  Instr *local_40;
  byte local_38;
  
  if (instrAdd->m_opcode != Add_I4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                       ,0x29,"(instrAdd->m_opcode == Js::OpCode::Add_I4)",
                       "instrAdd->m_opcode == Js::OpCode::Add_I4");
    if (!bVar2) goto LAB_005aee70;
    *puVar5 = 0;
  }
  if ((opndFold->field_0xb & 4) == 0) {
    return instrAdd;
  }
  bVar2 = IR::Opnd::IsRegOpnd(opndAdd);
  if (!bVar2) {
    if (opndAdd->m_type != TyInt32) {
      return instrAdd;
    }
    bVar2 = IR::Opnd::IsIntConstOpnd(opndAdd);
    if (!bVar2) {
      return instrAdd;
    }
  }
  bVar2 = IR::Opnd::IsRegOpnd(opndFold);
  if (!bVar2) {
    return instrAdd;
  }
  pRVar6 = IR::Opnd::AsRegOpnd(opndFold);
  if ((pRVar6->m_sym->field_0x18 & 1) == 0) {
    return instrAdd;
  }
  if ((pRVar6->m_sym->field_5).m_instrDef == (Instr *)0x0) {
    return instrAdd;
  }
  pRVar6 = IR::Opnd::AsRegOpnd(opndFold);
  pIVar12 = (pRVar6->m_sym->field_5).m_instrDef;
  this = (Instr *)0x0;
  if ((pRVar6->m_sym->field_0x18 & 1) != 0) {
    this = pIVar12;
  }
  if ((this->m_opcode | Break) != Shl_I4) {
    return instrAdd;
  }
  bVar2 = IR::Opnd::IsRegOpnd(this->m_src1);
  if (!bVar2) {
    return instrAdd;
  }
  bVar2 = IR::Opnd::IsIntConstOpnd(this->m_src2);
  if (!bVar2) {
    return instrAdd;
  }
  if ((this->field_0x38 & 0x10) != 0) {
    return instrAdd;
  }
  pIVar7 = IR::Opnd::AsIntConstOpnd(this->m_src2);
  uVar8 = (pIVar7->super_EncodableOpnd<long>).m_value;
  if (this->m_opcode == Mul_I4) {
LAB_005aeb5b:
    if (7 < uVar8 - 1) {
      return instrAdd;
    }
    uVar13 = (uint)(uVar8 - 1);
    if ((0x8bU >> (uVar13 & 0x1f) & 1) == 0) {
      return instrAdd;
    }
    uVar8 = 0x300000002000100 >> ((byte)(uVar13 << 3) & 0x3f);
  }
  else {
    if (this->m_opcode != Shl_I4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                         ,0x51,"(instrDef->m_opcode == Js::OpCode::Mul_I4)",
                         "instrDef->m_opcode == Js::OpCode::Mul_I4");
      if (!bVar2) goto LAB_005aee70;
      *puVar5 = 0;
      goto LAB_005aeb5b;
    }
    if (3 < uVar8) {
      return instrAdd;
    }
  }
  pRVar6 = IR::Opnd::AsRegOpnd(this->m_src1);
  sym = pRVar6->m_sym;
  pRVar6 = IR::Opnd::AsRegOpnd(opndFold);
  if (instrAdd->m_prev == (Instr *)0x0) {
    local_40 = (Instr *)0x0;
  }
  else {
    local_40 = instrAdd->m_prev->m_next;
  }
  sym_00 = pRVar6->m_sym;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pIVar14 = (Instr *)0x0;
  while (pIVar12 = pIVar12->m_next, pIVar12 != local_40) {
    if ((pIVar14 != (Instr *)0x0) && (pIVar14->m_next != pIVar12)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                         ,0x67,
                         "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instrIter)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar2) goto LAB_005aee70;
      *puVar5 = 0;
    }
    if (pIVar12->m_kind == InstrKindBranch) {
      return instrAdd;
    }
    if ((pIVar12->field_0x38 & 0x10) != 0) {
      return instrAdd;
    }
    pRVar6 = IR::Instr::FindRegDef(pIVar12,sym);
    if (pRVar6 != (RegOpnd *)0x0) {
      return instrAdd;
    }
    bVar2 = IR::Instr::HasSymUse(pIVar12,sym_00);
    pIVar14 = pIVar12;
    if (bVar2) {
      return instrAdd;
    }
  }
  uVar3 = Func::GetSourceContextId(instrAdd->m_func);
  uVar4 = Func::GetLocalFunctionId(instrAdd->m_func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,PreLowererPeepsPhase,uVar3,uVar4);
  if (bVar2) {
    pJVar9 = Func::GetJITFunctionBody(instrAdd->m_func);
    pcVar10 = JITTimeFunctionBody::GetDisplayName(pJVar9);
    uVar3 = Func::GetFunctionNumber(instrAdd->m_func);
    Output::Print(L"PeepShiftAdd : %s (%d) : folding:\n",pcVar10,(ulong)uVar3);
    IR::Instr::Dump(this);
    IR::Instr::Dump(instrAdd);
  }
  bVar2 = IR::Opnd::IsRegOpnd(opndAdd);
  local_38 = (byte)uVar8;
  if (bVar2) {
    pRVar6 = IR::Opnd::AsRegOpnd(opndAdd);
    pOVar11 = IR::Instr::UnlinkSrc1(this);
    indexOpnd = IR::Opnd::AsRegOpnd(pOVar11);
    src = IR::IndirOpnd::New(pRVar6,indexOpnd,local_38,opndFold->m_type,instrAdd->m_func);
  }
  else {
    if ((opndAdd->m_type != TyInt32) || (bVar2 = IR::Opnd::IsIntConstOpnd(opndAdd), !bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                         ,0x8c,"(opndAdd->IsInt32() && opndAdd->IsIntConstOpnd())",
                         "opndAdd->IsInt32() && opndAdd->IsIntConstOpnd()");
      if (!bVar2) {
LAB_005aee70:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    pOVar11 = IR::Instr::UnlinkSrc1(this);
    pRVar6 = IR::Opnd::AsRegOpnd(pOVar11);
    pIVar7 = IR::Opnd::AsIntConstOpnd(opndAdd);
    offset = IR::IntConstOpnd::AsInt32(pIVar7);
    src = IR::IndirOpnd::New(pRVar6,offset,local_38,opndFold->m_type,instrAdd->m_func);
  }
  pOVar11 = IR::Instr::UnlinkDst(instrAdd);
  pRVar6 = IR::Opnd::AsRegOpnd(pOVar11);
  pIVar12 = InsertLea(pRVar6,&src->super_Opnd,instrAdd);
  uVar3 = Func::GetSourceContextId(instrAdd->m_func);
  uVar4 = Func::GetLocalFunctionId(instrAdd->m_func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,PreLowererPeepsPhase,uVar3,uVar4);
  if (bVar2) {
    pJVar9 = Func::GetJITFunctionBody(instrAdd->m_func);
    pcVar10 = JITTimeFunctionBody::GetDisplayName(pJVar9);
    uVar3 = Func::GetFunctionNumber(instrAdd->m_func);
    Output::Print(L"into:\n",pcVar10,(ulong)uVar3);
    IR::Instr::Dump(pIVar12);
  }
  IR::Instr::Remove(instrAdd);
  IR::Instr::Remove(this);
  return pIVar12;
}

Assistant:

IR::Instr *
Lowerer::TryShiftAdd(IR::Instr *instrAdd, IR::Opnd * opndFold, IR::Opnd * opndAdd)
{
    Assert(instrAdd->m_opcode == Js::OpCode::Add_I4);
    if (!opndFold->GetIsDead())
    {
        return instrAdd;
    }

    if (!(opndAdd->IsRegOpnd() || (opndAdd->IsInt32() && opndAdd->IsIntConstOpnd())))
    {
        return instrAdd;
    }

    if (!opndFold->IsRegOpnd() || !opndFold->AsRegOpnd()->m_sym->IsSingleDef())
    {
        return instrAdd;
    }

    IR::Instr * instrDef = opndFold->AsRegOpnd()->m_sym->GetInstrDef();

    if ((instrDef->m_opcode != Js::OpCode::Shl_I4 && instrDef->m_opcode != Js::OpCode::Mul_I4) || !instrDef->GetSrc1()->IsRegOpnd()  || !instrDef->GetSrc2()->IsIntConstOpnd())
    {
        return instrAdd;
    }

    if (instrDef->HasBailOutInfo())
    {
        return instrAdd;
    }

    byte scale = 0;
    IntConstType constVal = instrDef->GetSrc2()->AsIntConstOpnd()->GetValue();
    if (instrDef->m_opcode == Js::OpCode::Shl_I4)
    {
        if (constVal < 0 || constVal > 3)
        {
            return instrAdd;
        }
        scale = (byte)constVal;
    }
    else
    {
        Assert(instrDef->m_opcode == Js::OpCode::Mul_I4);
        switch (constVal)
        {
        case 1:
            scale = 0;
            break;
        case 2:
            scale = 1;
            break;
        case 4:
            scale = 2;
            break;
        case 8:
            scale = 3;
            break;
        default:
            return instrAdd;
        }
    }

    StackSym * defSrc1Sym = instrDef->GetSrc1()->AsRegOpnd()->m_sym;
    StackSym * foldSym = opndFold->AsRegOpnd()->m_sym;
    FOREACH_INSTR_IN_RANGE(instrIter, instrDef->m_next, instrAdd->m_prev)
    {
        // if any branch between def-use, don't do peeps on it because branch target might depend on the def
        if (instrIter->IsBranchInstr())
        {
            return instrAdd;
        }
        if (instrIter->HasBailOutInfo())
        {
            return instrAdd;
        }
        if (instrIter->FindRegDef(defSrc1Sym))
        {
            return instrAdd;
        }
        if (instrIter->HasSymUse(foldSym))
        {
            return instrAdd;
        }
    } NEXT_INSTR_IN_RANGE;

#if DBG_DUMP
    if (PHASE_TRACE(Js::PreLowererPeepsPhase, instrAdd->m_func))
    {
        Output::Print(_u("PeepShiftAdd : %s (%d) : folding:\n"), instrAdd->m_func->GetJITFunctionBody()->GetDisplayName(), instrAdd->m_func->GetFunctionNumber());
        instrDef->Dump();
        instrAdd->Dump();
    }
#endif

    IR::IndirOpnd * leaOpnd = nullptr;
    if (opndAdd->IsRegOpnd())
    {
        leaOpnd = IR::IndirOpnd::New(opndAdd->AsRegOpnd(), instrDef->UnlinkSrc1()->AsRegOpnd(), scale, opndFold->GetType(), instrAdd->m_func);
    }
    else
    {
        Assert(opndAdd->IsInt32() && opndAdd->IsIntConstOpnd());
        leaOpnd = IR::IndirOpnd::New(instrDef->UnlinkSrc1()->AsRegOpnd(), opndAdd->AsIntConstOpnd()->AsInt32(), scale, opndFold->GetType(), instrAdd->m_func);
    }

    IR::Instr * leaInstr = InsertLea(instrAdd->UnlinkDst()->AsRegOpnd(), leaOpnd, instrAdd);

#if DBG_DUMP
    if (PHASE_TRACE(Js::PreLowererPeepsPhase, instrAdd->m_func))
    {
        Output::Print(_u("into:\n"), instrAdd->m_func->GetJITFunctionBody()->GetDisplayName(), instrAdd->m_func->GetFunctionNumber());
        leaInstr->Dump();
    }
#endif

    instrAdd->Remove();
    instrDef->Remove();

    return leaInstr;
}